

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall xLearn::DMATRIX_TEST_Compress_Test::TestBody(DMATRIX_TEST_Compress_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  reference ppvVar4;
  char *pcVar5;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  SparseRow *row;
  vector<unsigned_int,_std::allocator<unsigned_int>_> feature_list;
  DMatrix matrix;
  undefined7 in_stack_fffffffffffffa10;
  undefined1 in_stack_fffffffffffffa17;
  uint *in_stack_fffffffffffffa18;
  undefined7 in_stack_fffffffffffffa20;
  undefined1 in_stack_fffffffffffffa27;
  char *in_stack_fffffffffffffa28;
  undefined7 in_stack_fffffffffffffa50;
  undefined1 in_stack_fffffffffffffa57;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  index_t in_stack_fffffffffffffb00;
  real_t in_stack_fffffffffffffb04;
  undefined8 in_stack_fffffffffffffb08;
  undefined7 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb17;
  AssertHelper local_460;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbb0;
  undefined4 in_stack_fffffffffffffbb4;
  AssertionResult local_448;
  AssertHelper local_438;
  Message local_430;
  undefined4 local_424;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  undefined4 local_3fc;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined4 local_3d4;
  AssertionResult local_3d0;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined4 local_3ac;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  undefined4 local_384;
  AssertionResult local_380;
  AssertHelper local_370;
  Message local_368;
  undefined4 local_35c;
  AssertionResult local_358;
  AssertHelper local_348;
  Message local_340;
  undefined4 local_334;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined4 local_30c;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined4 local_2e4;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined4 local_2bc;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  AssertionResult local_290;
  AssertHelper local_280;
  Message local_278;
  undefined4 local_26c;
  AssertionResult local_268;
  AssertHelper local_258;
  Message local_250;
  undefined4 local_244;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  undefined4 local_21c;
  AssertionResult local_218;
  AssertHelper local_208;
  Message local_200;
  undefined4 local_1f4;
  AssertionResult local_1f0;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined4 local_1a4;
  AssertionResult local_1a0;
  AssertHelper local_190;
  Message local_188;
  undefined4 local_17c;
  AssertionResult local_178;
  AssertHelper local_168;
  Message local_160;
  undefined4 local_154;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined4 local_12c;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  undefined4 local_dc;
  AssertionResult local_d8;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98 [2];
  vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
  local_58 [3];
  
  DMatrix::DMatrix((DMatrix *)CONCAT17(in_stack_fffffffffffffa57,in_stack_fffffffffffffa50));
  DMatrix::Reset((DMatrix *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
  DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddRow((DMatrix *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20));
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  DMatrix::AddNode((DMatrix *)CONCAT17(in_stack_fffffffffffffb17,in_stack_fffffffffffffb10),
                   (index_t)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                   (index_t)in_stack_fffffffffffffb08,in_stack_fffffffffffffb04,
                   in_stack_fffffffffffffb00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x154c1f);
  DMatrix::Compress((DMatrix *)CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    in_stack_fffffffffffffba8.ptr_);
  ppvVar4 = std::
            vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ::operator[](local_58,0);
  local_a0 = *ppvVar4;
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,0);
  local_b4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x154d35);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x154d98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x154ded);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,1);
  local_dc = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x154ea5);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x154f08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x154f5d);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,2);
  local_104 = 7;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155015);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x155078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1550cd);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,3);
  local_12c = 8;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155185);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd5,pcVar5);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message((Message *)0x1551e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x155240);
  ppvVar4 = std::
            vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ::operator[](local_58,1);
  local_a0 = *ppvVar4;
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,0);
  local_154 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155314);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message((Message *)0x155377);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1553cc);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,1);
  local_17c = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155484);
    testing::internal::AssertHelper::AssertHelper
              (&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xd9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_190,&local_188);
    testing::internal::AssertHelper::~AssertHelper(&local_190);
    testing::Message::~Message((Message *)0x1554e7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15553c);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,2);
  local_1a4 = 0xb;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1555f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xda,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    testing::Message::~Message((Message *)0x155657);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1556af);
  ppvVar4 = std::
            vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ::operator[](local_58,2);
  local_a0 = *ppvVar4;
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,0);
  local_1cc = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155783);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xdd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    testing::Message::~Message((Message *)0x1557e6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15583b);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,1);
  local_1f4 = 7;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1558f3);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xde,pcVar5);
    testing::internal::AssertHelper::operator=(&local_208,&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    testing::Message::~Message((Message *)0x155956);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1559ab);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,2);
  local_21c = 9;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155a63);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xdf,pcVar5);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message((Message *)0x155ac6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x155b1e);
  ppvVar4 = std::
            vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ::operator[](local_58,3);
  local_a0 = *ppvVar4;
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,0);
  local_244 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_240);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155bf2);
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe2,pcVar5);
    testing::internal::AssertHelper::operator=(&local_258,&local_250);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    testing::Message::~Message((Message *)0x155c55);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x155caa);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,1);
  local_26c = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155d62);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe3,pcVar5);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    testing::Message::~Message((Message *)0x155dc5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x155e1a);
  std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>::operator[](local_a0,2);
  local_294 = 6;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x155ed2);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message((Message *)0x155f35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x155f8a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,0);
  local_2bc = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x15603d);
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe6,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    testing::Message::~Message((Message *)0x1560a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1560f5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,1);
  local_2e4 = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1561a9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe7,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    testing::Message::~Message((Message *)0x15620c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156261);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,2);
  local_30c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x156315);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe8,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message((Message *)0x156378);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1563cd);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,3);
  local_334 = 4;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar1) {
    testing::Message::Message(&local_340);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x15647b);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xe9,pcVar5);
    testing::internal::AssertHelper::operator=(&local_348,&local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    testing::Message::~Message((Message *)0x1564d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15652d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,4);
  local_35c = 5;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_358);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1565db);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xea,pcVar5);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    testing::Message::~Message((Message *)0x156638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15668d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,5);
  local_384 = 7;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x15673b);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xeb,pcVar5);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    testing::Message::~Message((Message *)0x156798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1567ed);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,6);
  local_3ac = 8;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3b8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x15689b);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xec,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message((Message *)0x1568f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x15694d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,7);
  local_3d4 = 10;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x1569fb);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xed,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message((Message *)0x156a58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156aad);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,8);
  local_3fc = 0xb;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    in_stack_fffffffffffffa28 =
         testing::AssertionResult::failure_message((AssertionResult *)0x156b5b);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xee,in_stack_fffffffffffffa28);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    testing::Message::~Message((Message *)0x156bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156c0d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,9);
  local_424 = 0xc;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,
             (char *)CONCAT17(in_stack_fffffffffffffa27,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_420);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_430);
    in_stack_fffffffffffffa18 =
         (uint *)testing::AssertionResult::failure_message((AssertionResult *)0x156cbb);
    testing::internal::AssertHelper::AssertHelper
              (&local_438,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xef,(char *)in_stack_fffffffffffffa18);
    testing::internal::AssertHelper::operator=(&local_438,&local_430);
    testing::internal::AssertHelper::~AssertHelper(&local_438);
    testing::Message::~Message((Message *)0x156d18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156d6d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](local_98,10);
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            (in_stack_fffffffffffffa28,(char *)CONCAT17(uVar2,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18,
             (int *)CONCAT17(in_stack_fffffffffffffa17,in_stack_fffffffffffffa10));
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_448);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)&stack0xfffffffffffffba8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x156e1b);
    testing::internal::AssertHelper::AssertHelper
              (&local_460,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/data/data_structure_test.cc"
               ,0xf0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_460,(Message *)&stack0xfffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(&local_460);
    testing::Message::~Message((Message *)0x156e76);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x156ecb);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffa20));
  DMatrix::~DMatrix((DMatrix *)CONCAT17(uVar3,in_stack_fffffffffffffa10));
  return;
}

Assistant:

TEST(DMATRIX_TEST, Compress) {
  // Init matrix
  DMatrix matrix;
  matrix.Reset();
  // row_0
  matrix.AddRow();
  matrix.AddNode(0, 1, 0.1);
  matrix.AddNode(0, 5, 0.1);
  matrix.AddNode(0, 8, 0.1);
  matrix.AddNode(0, 10, 0.1);
  // row_1
  matrix.AddRow();
  matrix.AddNode(1, 3, 0.1);
  matrix.AddNode(1, 12, 0.1);
  matrix.AddNode(1, 20, 0.1);
  // row_2
  matrix.AddRow();
  matrix.AddNode(2, 5, 0.1);
  matrix.AddNode(2, 8, 0.1);
  matrix.AddNode(2, 11, 0.1);
  // row_3
  matrix.AddRow();
  matrix.AddNode(3, 2, 0.1);
  matrix.AddNode(3, 4, 0.1);
  matrix.AddNode(3, 7, 0.1);
  // Compress
  std::vector<index_t> feature_list;
  matrix.Compress(feature_list);
  // row_0
  SparseRow* row = matrix.row[0];
  EXPECT_EQ((*row)[0].feat_id, 1);
  EXPECT_EQ((*row)[1].feat_id, 5);
  EXPECT_EQ((*row)[2].feat_id, 7);
  EXPECT_EQ((*row)[3].feat_id, 8);
  // row_1
  row = matrix.row[1];
  EXPECT_EQ((*row)[0].feat_id, 3);
  EXPECT_EQ((*row)[1].feat_id, 10);
  EXPECT_EQ((*row)[2].feat_id, 11);
  // row_2
  row = matrix.row[2];
  EXPECT_EQ((*row)[0].feat_id, 5);
  EXPECT_EQ((*row)[1].feat_id, 7);
  EXPECT_EQ((*row)[2].feat_id, 9);
  // row_3
  row = matrix.row[3];
  EXPECT_EQ((*row)[0].feat_id, 2);
  EXPECT_EQ((*row)[1].feat_id, 4);
  EXPECT_EQ((*row)[2].feat_id, 6);
  // feature list
  EXPECT_EQ(feature_list[0], 1);
  EXPECT_EQ(feature_list[1], 2);
  EXPECT_EQ(feature_list[2], 3);
  EXPECT_EQ(feature_list[3], 4);
  EXPECT_EQ(feature_list[4], 5);
  EXPECT_EQ(feature_list[5], 7);
  EXPECT_EQ(feature_list[6], 8);
  EXPECT_EQ(feature_list[7], 10);
  EXPECT_EQ(feature_list[8], 11);
  EXPECT_EQ(feature_list[9], 12);
  EXPECT_EQ(feature_list[10], 20);
}